

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builtin.c
# Opt level: O0

int arguments_choose(dmr_C *C,expression *expr)

{
  symbol *psVar1;
  undefined1 local_50 [8];
  ptr_list_iter argiter__;
  expression *peStack_30;
  int i;
  expression *arg;
  expression_list *arglist;
  expression *expr_local;
  dmr_C *C_local;
  
  argiter__._20_4_ = 0;
  ptrlist_forward_iterator((ptr_list_iter *)local_50,(ptr_list *)(expr->field_5).field_2.string);
  peStack_30 = (expression *)ptrlist_iter_next((ptr_list_iter *)local_50);
  while( true ) {
    if (peStack_30 == (expression *)0x0) {
      if ((int)argiter__._20_4_ < 3) {
        dmrC_sparse_error(C,expr->pos,"not enough arguments for __builtin_choose_expr");
        C_local._4_4_ = 0;
      }
      else if ((int)argiter__._20_4_ < 4) {
        C_local._4_4_ = 1;
      }
      else {
        dmrC_sparse_error(C,expr->pos,"too many arguments for __builtin_choose_expr");
        C_local._4_4_ = 0;
      }
      return C_local._4_4_;
    }
    psVar1 = dmrC_evaluate_expression(C,peStack_30);
    if (psVar1 == (symbol *)0x0) break;
    argiter__._20_4_ = argiter__._20_4_ + 1;
    peStack_30 = (expression *)ptrlist_iter_next((ptr_list_iter *)local_50);
  }
  return 0;
}

Assistant:

static int arguments_choose(struct dmr_C *C, struct expression *expr)
{
	struct expression_list *arglist = expr->args;
	struct expression *arg;
	int i = 0;

	FOR_EACH_PTR (arglist, arg) {
		if (!dmrC_evaluate_expression(C, arg))
			return 0;
		i++;
	} END_FOR_EACH_PTR(arg);
	if (i < 3) {
		dmrC_sparse_error(C, expr->pos,
			     "not enough arguments for __builtin_choose_expr");
		return 0;
	} if (i > 3) {
		dmrC_sparse_error(C, expr->pos,
			     "too many arguments for __builtin_choose_expr");
		return 0;
	}
	return 1;
}